

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_CDict *
ZSTD_createCDict_advanced2
          (void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_CCtx_params *originalCctxParams,
          ZSTD_customMem customMem)

{
  ZSTD_CCtx_params params;
  ZSTD_compressionParameters cParams_00;
  ZSTD_customMem customMem_00;
  int iVar1;
  uint uVar2;
  ZSTD_CDict *pZVar3;
  long lVar4;
  undefined4 in_EDX;
  undefined8 *puVar5;
  undefined8 in_RDI;
  undefined8 *puVar6;
  void *in_R8;
  byte bVar7;
  ZSTD_CDict *cdict;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params cctxParams;
  ZSTD_compressionParameters *in_stack_fffffffffffffd78;
  ZSTD_paramSwitch_e in_stack_fffffffffffffd80;
  size_t in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd94;
  ZSTD_CDict *cdict_00;
  ZSTD_cParamMode_e in_stack_fffffffffffffddc;
  size_t in_stack_fffffffffffffde0;
  U64 in_stack_fffffffffffffde8;
  ZSTD_dictContentType_e in_stack_fffffffffffffdf0;
  ZSTD_dictLoadMethod_e in_stack_fffffffffffffdf4;
  size_t in_stack_fffffffffffffdf8;
  void *in_stack_fffffffffffffe00;
  ZSTD_CDict *in_stack_fffffffffffffe08;
  U32 in_stack_fffffffffffffe1c;
  ZSTD_paramSwitch_e in_stack_fffffffffffffe20;
  ZSTD_dictLoadMethod_e in_stack_fffffffffffffe24;
  size_t in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe30 [16];
  undefined1 auVar8 [12];
  undefined1 in_stack_fffffffffffffe40 [16];
  undefined8 in_stack_fffffffffffffe50;
  ZSTD_strategy in_stack_fffffffffffffe58;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  long *plVar11;
  void *pvVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ZSTD_strategy ZVar15;
  undefined8 in_stack_fffffffffffffe8c;
  undefined8 in_stack_fffffffffffffe94;
  undefined8 in_stack_fffffffffffffe9c;
  ZSTD_strategy in_stack_fffffffffffffea4;
  undefined8 in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  ZSTD_strategy in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec4;
  undefined8 in_stack_fffffffffffffecc;
  undefined8 uVar16;
  undefined8 in_stack_fffffffffffffed4;
  undefined8 uVar17;
  ZSTD_strategy in_stack_fffffffffffffedc;
  ZSTD_strategy ZVar18;
  undefined4 in_stack_fffffffffffffee8;
  uint uStack_110;
  uint local_10c;
  uint uStack_108;
  uint local_104;
  uint uStack_100;
  ZSTD_strategy local_fc;
  undefined1 local_f8 [4];
  ZSTD_compressionParameters local_f4 [4];
  int local_80;
  ZSTD_paramSwitch_e local_68;
  undefined4 local_1c;
  undefined8 local_10;
  ZSTD_CDict *local_8;
  
  bVar7 = 0;
  plVar11 = (long *)&stack0x00000008;
  local_1c = in_EDX;
  local_10 = in_RDI;
  memcpy(local_f8,in_R8,0xd0);
  if ((*plVar11 == 0) == (plVar11[1] == 0)) {
    if (local_80 == 0) {
      ZSTD_getCParamsFromCCtxParams
                ((ZSTD_CCtx_params *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      uVar2 = (uint)in_stack_fffffffffffffea8;
      uStack_110 = (uint)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      uVar16 = in_stack_fffffffffffffecc;
      uVar17 = in_stack_fffffffffffffed4;
      ZVar18 = in_stack_fffffffffffffedc;
      _local_10c = in_stack_fffffffffffffeb0;
      _local_104 = in_stack_fffffffffffffeb8;
      local_fc = in_stack_fffffffffffffec0;
    }
    else {
      ZSTD_dedicatedDictSearch_getCParams(in_stack_fffffffffffffd94,in_stack_fffffffffffffd88);
      uVar2 = (uint)in_stack_fffffffffffffec4;
      uStack_110 = (uint)((ulong)in_stack_fffffffffffffec4 >> 0x20);
      uVar16 = in_stack_fffffffffffffecc;
      uVar17 = in_stack_fffffffffffffed4;
      ZVar18 = in_stack_fffffffffffffedc;
      ZSTD_overrideCParams((ZSTD_compressionParameters *)&stack0xfffffffffffffeec,local_f4);
      _local_10c = in_stack_fffffffffffffecc;
      _local_104 = in_stack_fffffffffffffed4;
      local_fc = in_stack_fffffffffffffedc;
    }
    iVar1 = ZSTD_dedicatedDictSearch_isSupported
                      ((ZSTD_compressionParameters *)&stack0xfffffffffffffeec);
    if (iVar1 == 0) {
      local_80 = 0;
      ZSTD_getCParamsFromCCtxParams
                ((ZSTD_CCtx_params *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      uVar2 = (uint)in_stack_fffffffffffffe8c;
      uStack_110 = (uint)((ulong)in_stack_fffffffffffffe8c >> 0x20);
      _local_10c = in_stack_fffffffffffffe94;
      _local_104 = in_stack_fffffffffffffe9c;
      local_fc = in_stack_fffffffffffffea4;
    }
    local_f4[0]._0_8_ = CONCAT44(uStack_110,uVar2);
    local_f4[0].hashLog = local_10c;
    local_f4[0].searchLog = uStack_108;
    local_f4[0].minMatch = local_104;
    local_f4[0].targetLength = uStack_100;
    local_f4[0].strategy = local_fc;
    local_68 = ZSTD_resolveRowMatchFinderMode(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    cdict_00 = (ZSTD_CDict *)plVar11[2];
    cParams_00.minMatch = (int)in_stack_fffffffffffffe50;
    cParams_00.targetLength = (int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
    cParams_00.windowLog = in_stack_fffffffffffffe40._0_4_;
    cParams_00.chainLog = in_stack_fffffffffffffe40._4_4_;
    cParams_00.hashLog = in_stack_fffffffffffffe40._8_4_;
    cParams_00.searchLog = in_stack_fffffffffffffe40._12_4_;
    cParams_00.strategy = in_stack_fffffffffffffe58;
    customMem_00.customAlloc._4_4_ = in_stack_fffffffffffffe64;
    customMem_00.customAlloc._0_4_ = in_stack_fffffffffffffe60;
    customMem_00.customFree = (ZSTD_freeFunction)plVar11;
    customMem_00.opaque = (void *)local_f4[0]._0_8_;
    pvVar12 = (void *)local_f4[0]._0_8_;
    uVar13 = local_f4[0]._8_8_;
    uVar14 = local_f4[0]._16_8_;
    ZVar15 = local_f4[0].strategy;
    pZVar3 = ZSTD_createCDict_advanced_internal
                       (in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,cParams_00,
                        in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,customMem_00);
    uVar9 = SUB84(pZVar3,0);
    uVar10 = (undefined4)((ulong)pZVar3 >> 0x20);
    puVar5 = (undefined8 *)local_f8;
    puVar6 = (undefined8 *)&stack0xfffffffffffffd78;
    for (lVar4 = 0x1a; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
    }
    params.cParams.windowLog = in_stack_fffffffffffffe24;
    params.format = in_stack_fffffffffffffe20;
    params.cParams.chainLog = (int)in_stack_fffffffffffffe28;
    params.cParams.hashLog = (int)(in_stack_fffffffffffffe28 >> 0x20);
    params.cParams.searchLog = in_stack_fffffffffffffe30._0_4_;
    params.cParams.minMatch = in_stack_fffffffffffffe30._4_4_;
    params.cParams.targetLength = in_stack_fffffffffffffe30._8_4_;
    params.cParams.strategy = in_stack_fffffffffffffe30._12_4_;
    auVar8 = in_stack_fffffffffffffe40._0_12_;
    params.fParams.contentSizeFlag = auVar8._0_4_;
    params.fParams.checksumFlag = auVar8._4_4_;
    params.fParams.noDictIDFlag = auVar8._8_4_;
    params.compressionLevel = in_stack_fffffffffffffe40._12_4_;
    params._48_8_ = local_10;
    params.targetCBlockSize._0_4_ = uVar9;
    params.targetCBlockSize._4_4_ = uVar10;
    params.srcSizeHint = in_stack_fffffffffffffe60;
    params.attachDictPref = local_1c;
    params._72_8_ = plVar11;
    params.jobSize = (size_t)pvVar12;
    params.overlapLog = (uint)uVar13;
    params.rsyncable = SUB84(uVar13,4);
    params.ldmParams.enableLdm = (uint)uVar14;
    params.ldmParams.hashLog = SUB84(uVar14,4);
    params.ldmParams.bucketSizeLog = ZVar15;
    params.ldmParams.minMatchLength = (int)in_stack_fffffffffffffe8c;
    params.ldmParams.hashRateLog = (int)((ulong)in_stack_fffffffffffffe8c >> 0x20);
    params.ldmParams.windowLog = (uint)in_stack_fffffffffffffe94;
    params.enableDedicatedDictSearch = SUB84(in_stack_fffffffffffffe94,4);
    params.inBufferMode = (uint)in_stack_fffffffffffffe9c;
    params.outBufferMode = SUB84(in_stack_fffffffffffffe9c,4);
    params.blockDelimiters = in_stack_fffffffffffffea4;
    params.validateSequences = (int)in_stack_fffffffffffffea8;
    params.useBlockSplitter = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    params.useRowMatchFinder = (uint)in_stack_fffffffffffffeb0;
    params.deterministicRefPrefix = SUB84(in_stack_fffffffffffffeb0,4);
    params.customMem.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffeb8;
    params.customMem.customFree._0_4_ = in_stack_fffffffffffffec0;
    params.customMem._12_8_ = in_stack_fffffffffffffec4;
    params._172_8_ = uVar16;
    params.enableMatchFinderFallback = (uint)uVar17;
    params.useSequenceProducer = SUB84(uVar17,4);
    params._188_4_ = ZVar18;
    params.maxBlockSize = (size_t)pZVar3;
    params.searchForExternalRepcodes = in_stack_fffffffffffffee8;
    params._204_4_ = uVar2;
    ZSTD_initCDict_internal
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,params);
    uVar2 = ZSTD_isError(0x23c568);
    local_8 = pZVar3;
    if (uVar2 != 0) {
      ZSTD_freeCDict(cdict_00);
      local_8 = (ZSTD_CDict *)0x0;
    }
  }
  else {
    local_8 = (ZSTD_CDict *)0x0;
  }
  return local_8;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced2(
        const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod,
        ZSTD_dictContentType_e dictContentType,
        const ZSTD_CCtx_params* originalCctxParams,
        ZSTD_customMem customMem)
{
    ZSTD_CCtx_params cctxParams = *originalCctxParams;
    ZSTD_compressionParameters cParams;
    ZSTD_CDict* cdict;

    DEBUGLOG(3, "ZSTD_createCDict_advanced2, mode %u", (unsigned)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    if (cctxParams.enableDedicatedDictSearch) {
        cParams = ZSTD_dedicatedDictSearch_getCParams(
            cctxParams.compressionLevel, dictSize);
        ZSTD_overrideCParams(&cParams, &cctxParams.cParams);
    } else {
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    if (!ZSTD_dedicatedDictSearch_isSupported(&cParams)) {
        /* Fall back to non-DDSS params */
        cctxParams.enableDedicatedDictSearch = 0;
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    DEBUGLOG(3, "ZSTD_createCDict_advanced2: DDS: %u", cctxParams.enableDedicatedDictSearch);
    cctxParams.cParams = cParams;
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);

    cdict = ZSTD_createCDict_advanced_internal(dictSize,
                        dictLoadMethod, cctxParams.cParams,
                        cctxParams.useRowMatchFinder, cctxParams.enableDedicatedDictSearch,
                        customMem);

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                    dict, dictSize,
                                    dictLoadMethod, dictContentType,
                                    cctxParams) )) {
        ZSTD_freeCDict(cdict);
        return NULL;
    }

    return cdict;
}